

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[9],char_const*,char[22],char_const*,char[10],char_const*,char[101],char_const*,char[5],char_const*,char[18]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [9],char **Args_1,
          char (*Args_2) [22],char **Args_3,char (*Args_4) [10],char **Args_5,char (*Args_6) [101],
          char **Args_7,char (*Args_8) [5],char **Args_9,char (*Args_10) [18])

{
  stringstream local_1e0 [8];
  stringstream ss;
  char (*Args_local_4) [10];
  char **Args_local_3;
  char (*Args_local_2) [22];
  char **Args_local_1;
  char (*Args_local) [9];
  
  std::__cxx11::stringstream::stringstream(local_1e0);
  FormatStrSS<std::__cxx11::stringstream,char[9],char_const*,char[22],char_const*,char[10],char_const*,char[101],char_const*,char[5],char_const*,char[18]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
             (char (*) [9])this,(char **)Args,(char (*) [22])Args_1,(char **)Args_2,
             (char (*) [10])Args_3,(char **)Args_4,(char (*) [101])Args_5,(char **)Args_6,
             (char (*) [5])Args_7,(char **)Args_8,(char (*) [18])Args_9);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1e0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}